

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_system.c
# Opt level: O0

void ppu_tick(nes_system *system)

{
  undefined1 local_30 [8];
  nes_video_output video_output;
  int is_reg_read;
  nes_system_state *state;
  nes_system *system_local;
  
  video_output._12_4_ = ZEXT14((system->state).ppu.reg_rw_mode == '\x01');
  if (((byte)(system->state).ppu.field_0xa >> 3 & 1) != 0 ||
      ((byte)(system->state).ppu.field_0xa >> 4 & 1) != 0) {
    ppu_mem_rw(system);
  }
  nes_ppu_execute(&(system->state).ppu);
  if (video_output._12_4_ != 0) {
    ppu_cpu_bus(system);
  }
  system->framebuffer[(system->state).ppu.scanline * 0x155 + (system->state).ppu.dot] =
       (system->state).ppu.color_out;
  if ((((system->config).video_callback != (_func_void_nes_video_output_ptr_void_ptr *)0x0) &&
      ((system->state).ppu.scanline == 0xf1)) && ((system->state).ppu.dot == 0)) {
    local_30 = (undefined1  [8])(system->framebuffer + 0xaaa);
    video_output.framebuffer._0_2_ = 0x100;
    video_output.framebuffer._2_2_ = 0xe0;
    video_output.framebuffer._4_1_ =
         video_output.framebuffer._4_1_ & 0xf0 | (system->state).ppu.is_even_frame == 0;
    (*(system->config).video_callback)((nes_video_output *)local_30,(system->config).client_data);
  }
  return;
}

Assistant:

static void ppu_tick(nes_system* system)
{
    nes_system_state* state = &system->state;

    int is_reg_read = (state->ppu.reg_rw_mode == NES_PPU_REG_RW_MODE_READ);

    if (state->ppu.r | state->ppu.w)
        ppu_mem_rw(system);

    nes_ppu_execute(&state->ppu);

    if (is_reg_read)
        ppu_cpu_bus(system);
    
    system->framebuffer[state->ppu.scanline * SCANLINE_WIDTH + state->ppu.dot] = state->ppu.color_out;
   
    if (system->config.video_callback && state->ppu.scanline == (RENDER_END_SCANLINE + 1) && state->ppu.dot == 0)
    {
        nes_video_output video_output;
        video_output.framebuffer = (nes_pixel*)(system->framebuffer + 2 + (NES_FRAMEBUFFER_ROW_STRIDE * 8));
        video_output.width  = 256;
        video_output.height = 224;
        video_output.odd_frame = !state->ppu.is_even_frame;
        video_output.emphasize_red      = state->ppu.render_mask & NES_PPU_RENDER_MASK_EMPHASIZE_RED;
        video_output.emphasize_green    = state->ppu.render_mask & NES_PPU_RENDER_MASK_EMPHASIZE_GREEN;
        video_output.emphasize_blue     = state->ppu.render_mask & NES_PPU_RENDER_MASK_EMPHASIZE_BLUE;

        system->config.video_callback(&video_output, system->config.client_data);
    }
}